

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.cpp
# Opt level: O1

flags __thiscall setup::header::load_flags(header *this,istream *is,version *version)

{
  _WordT _Var1;
  Type TVar2;
  char buffer [1];
  stored_flag_reader<flags<setup::header::flags_Enum_,_65UL>_> flagreader;
  undefined1 local_51;
  stored_flag_reader<setup::header::flags_Enum_> local_50;
  
  local_50.pad_bits =
       (ulong)(((version->variant)._flags.super__Base_bitset<1UL>._M_w & 1) == 0) * 0x10 + 0x10;
  local_50.pos = 0;
  local_50.buffer = '\0';
  local_50.result._flags.super__Base_bitset<2UL>._M_w[0] = 0;
  local_50.result._flags.super__Base_bitset<2UL>._M_w[1] = 0;
  local_50.bytes = 0;
  local_50.stream = is;
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableStartupPrompt);
  if (version->value < 0x5030a00) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,Uninstallable);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,CreateAppDir);
  if (version->value < 0x5030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableDirPage);
  }
  if (version->value < 0x1030600) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableDirExistsWarning);
  }
  if (version->value < 0x5030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableProgramGroupPage);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AllowNoIcons);
  if (version->value + 0xfcfffd00 < 0xfffffd00) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysRestart);
  }
  if (version->value < 0x1030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,BackSolid);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysUsePersonalGroup);
  if (version->value < 0x6040001) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WindowVisible);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WindowShowCaption);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WindowResizable);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WindowStartMaximized);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,EnableDirDoesntExistWarning);
  if (version->value < 0x4010200) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableAppendDir);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,Password);
  if (0x10205ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AllowRootDirectory);
  }
  if (0x1020dff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableFinishedPage);
  }
  if (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    if (version->value < 0x3000400) {
      stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AdminPrivilegesRequired);
    }
    if (version->value < 0x3000000) {
      stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysCreateUninstallIcon);
    }
    if (version->value < 0x1030600) {
      stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,OverwriteUninstRegEntries);
    }
    if (version->value < 0x5060100) {
      stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ChangesAssociations);
    }
  }
  if (version->value + 0xfefd0000 < 0x4000800) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,CreateUninstallRegKey);
  }
  if (0x10300ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousAppDir);
  }
  if (version->value + 0xfefcfd00 < 0x500fd01) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,BackColorHorizontal);
  }
  if (0x10309ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousGroup);
  }
  if (0x10313ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UpdateUninstallLogAppName);
  }
  if ((0x1ffffff < version->value) ||
     ((0x10309ff < version->value &&
      (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 4) != 0)))) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousSetupType);
  }
  if (0x1ffffff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableReadyMemo);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysShowComponentsList);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,FlatComponentsList);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ShowComponentSizes);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousTasks);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableReadyPage);
  }
  if (0x20006ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysShowDirOnReadyPage);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AlwaysShowGroupOnReadyPage);
  }
  if (version->value + 0xfdffef00 < 0x200f400) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,BzipUsed);
  }
  if (0x20011ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AllowUNCPath);
  }
  if (0x2ffffff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UserInfoPage);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousUserInfo);
  }
  if (0x30000ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UninstallRestartComputer);
  }
  if (0x30002ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,RestartIfNeededByRun);
  }
  if ((0x3ffffff < version->value) ||
     ((0x30002ff < version->value &&
      (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 4) != 0)))) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ShowTasksTreeLines);
  }
  if (version->value + 0xfc000000 < 0xa00) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ShowLanguageDialog);
  }
  if (version->value + 0xfbffff00 < 0x900) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DetectLanguageUsingLocale);
  }
  if (version->value < 0x4000900) {
    _Var1 = (this->options)._flags.super__Base_bitset<2UL>._M_w[1];
    (this->options)._flags.super__Base_bitset<2UL>._M_w[0] =
         (this->options)._flags.super__Base_bitset<2UL>._M_w[0] | 0x200000000;
    (this->options)._flags.super__Base_bitset<2UL>._M_w[1] = _Var1;
  }
  else {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AllowCancelDuringInstall);
  }
  if (0x40102ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WizardImageStretch);
  }
  if (0x40107ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AppendDefaultDirName);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AppendDefaultGroupName);
  }
  if (0x40201ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,EncryptionUsed);
  }
  if (version->value + 0xfafffc00 < 0x5fd00) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ChangesEnvironment);
  }
  if ((0x50106ff < version->value) &&
     (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 2) == 0)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ShowUndisplayableLanguages);
  }
  if (0x5010cff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,SetupLogging);
  }
  if (0x50200ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,SignedUninstaller);
  }
  if (0x50307ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousLanguage);
  }
  if (0x50308ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,DisableWelcomePage);
  }
  if (version->value < 0x5050000) {
    _Var1 = (this->options)._flags.super__Base_bitset<2UL>._M_w[1];
    (this->options)._flags.super__Base_bitset<2UL>._M_w[0] =
         (this->options)._flags.super__Base_bitset<2UL>._M_w[0] | 0x400000000000;
    (this->options)._flags.super__Base_bitset<2UL>._M_w[1] = _Var1;
  }
  else {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,CloseApplications);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,RestartApplications);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AllowNetworkDrive);
  }
  if (0x50506ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,ForceCloseApplications);
  }
  if (0x5ffffff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,AppNameHasConsts);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UsePreviousPrivileges);
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,WizardResizable);
  }
  if (0x602ffff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add(&local_50,UninstallLogging);
  }
  if ((local_50.bytes == 3) && (local_50.pad_bits == 0x20)) {
    std::istream::read((char *)local_50.stream,(long)&local_51);
  }
  TVar2.super__Base_bitset<2UL>._M_w[1] = local_50.result._flags.super__Base_bitset<2UL>._M_w[1];
  TVar2.super__Base_bitset<2UL>._M_w[0] = local_50.result._flags.super__Base_bitset<2UL>._M_w[0];
  return (Type)(Type)TVar2.super__Base_bitset<2UL>._M_w;
}

Assistant:

header::flags header::load_flags(std::istream & is, const version & version) {
	
	stored_flag_reader<flags> flagreader(is, version.bits());
	
	flagreader.add(DisableStartupPrompt);
	if(version < INNO_VERSION(5, 3, 10)) {
		flagreader.add(Uninstallable);
	}
	flagreader.add(CreateAppDir);
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableDirPage);
	}
	if(version < INNO_VERSION(1, 3, 6)) {
		flagreader.add(DisableDirExistsWarning);
	}
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableProgramGroupPage);
	}
	flagreader.add(AllowNoIcons);
	if(version < INNO_VERSION(3, 0, 0) || version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(AlwaysRestart);
	}
	if(version < INNO_VERSION(1, 3, 3)) {
		flagreader.add(BackSolid);
	}
	flagreader.add(AlwaysUsePersonalGroup);
	if(version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(WindowVisible);
		flagreader.add(WindowShowCaption);
		flagreader.add(WindowResizable);
		flagreader.add(WindowStartMaximized);
	}
	flagreader.add(EnableDirDoesntExistWarning);
	if(version < INNO_VERSION(4, 1, 2)) {
		flagreader.add(DisableAppendDir);
	}
	flagreader.add(Password);
	if(version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(AllowRootDirectory);
	}
	if(version >= INNO_VERSION(1, 2, 14)) {
		flagreader.add(DisableFinishedPage);
	}
	if(version.bits() != 16) {
		if(version < INNO_VERSION(3, 0, 4)) {
			flagreader.add(AdminPrivilegesRequired);
		}
		if(version < INNO_VERSION(3, 0, 0)) {
			flagreader.add(AlwaysCreateUninstallIcon);
		}
		if(version < INNO_VERSION(1, 3, 6)) {
			flagreader.add(OverwriteUninstRegEntries);
		}
		if(version < INNO_VERSION(5, 6, 1)) {
			flagreader.add(ChangesAssociations);
		}
	}
	if(version >= INNO_VERSION(1, 3, 0) && version < INNO_VERSION(5, 3, 8)) {
		flagreader.add(CreateUninstallRegKey);
	}
	if(version >= INNO_VERSION(1, 3, 1)) {
		flagreader.add(UsePreviousAppDir);
	}
	if(version >= INNO_VERSION(1, 3, 3) && version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(BackColorHorizontal);
	}
	if(version >= INNO_VERSION(1, 3, 10)) {
		flagreader.add(UsePreviousGroup);
	}
	if(version >= INNO_VERSION(1, 3, 20)) {
		flagreader.add(UpdateUninstallLogAppName);
	}
	if(version >= INNO_VERSION(2, 0, 0) || (version.is_isx() && version >= INNO_VERSION(1, 3, 10))) {
		flagreader.add(UsePreviousSetupType);
	}
	if(version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(DisableReadyMemo);
		flagreader.add(AlwaysShowComponentsList);
		flagreader.add(FlatComponentsList);
		flagreader.add(ShowComponentSizes);
		flagreader.add(UsePreviousTasks);
		flagreader.add(DisableReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 7)) {
		flagreader.add(AlwaysShowDirOnReadyPage);
		flagreader.add(AlwaysShowGroupOnReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 17) && version < INNO_VERSION(4, 1, 5)) {
		flagreader.add(BzipUsed);
	}
	if(version >= INNO_VERSION(2, 0, 18)) {
		flagreader.add(AllowUNCPath);
	}
	if(version >= INNO_VERSION(3, 0, 0)) {
		flagreader.add(UserInfoPage);
		flagreader.add(UsePreviousUserInfo);
	}
	if(version >= INNO_VERSION(3, 0, 1)) {
		flagreader.add(UninstallRestartComputer);
	}
	if(version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(RestartIfNeededByRun);
	}
	if(version >= INNO_VERSION(4, 0, 0) || (version.is_isx() && version >= INNO_VERSION(3, 0, 3))) {
		flagreader.add(ShowTasksTreeLines);
	}
	if(version >= INNO_VERSION(4, 0, 0) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(ShowLanguageDialog);
	}
	if(version >= INNO_VERSION(4, 0, 1) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(DetectLanguageUsingLocale);
	}
	if(version >= INNO_VERSION(4, 0, 9)) {
		flagreader.add(AllowCancelDuringInstall);
	} else {
		options |= AllowCancelDuringInstall;
	}
	if(version >= INNO_VERSION(4, 1, 3)) {
		flagreader.add(WizardImageStretch);
	}
	if(version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(AppendDefaultDirName);
		flagreader.add(AppendDefaultGroupName);
	}
	if(version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(EncryptionUsed);
	}
	if(version >= INNO_VERSION(5, 0, 4) && version < INNO_VERSION(5, 6, 1)) {
		flagreader.add(ChangesEnvironment);
	}
	if(version >= INNO_VERSION(5, 1, 7) && !version.is_unicode()) {
		flagreader.add(ShowUndisplayableLanguages);
	}
	if(version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SetupLogging);
	}
	if(version >= INNO_VERSION(5, 2, 1)) {
		flagreader.add(SignedUninstaller);
	}
	if(version >= INNO_VERSION(5, 3, 8)) {
		flagreader.add(UsePreviousLanguage);
	}
	if(version >= INNO_VERSION(5, 3, 9)) {
		flagreader.add(DisableWelcomePage);
	}
	if(version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(CloseApplications);
		flagreader.add(RestartApplications);
		flagreader.add(AllowNetworkDrive);
	} else {
		options |= AllowNetworkDrive;
	}
	if(version >= INNO_VERSION(5, 5, 7)) {
		flagreader.add(ForceCloseApplications);
	}
	if(version >= INNO_VERSION(6, 0, 0)) {
		flagreader.add(AppNameHasConsts);
		flagreader.add(UsePreviousPrivileges);
		flagreader.add(WizardResizable);
	}
	if(version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(UninstallLogging);
	}
	
	return flagreader.finalize();
}